

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O3

InplaceStr GetArgumentSetTypeName(ExpressionContext *ctx,IntrusiveList<TypeHandle> types)

{
  char *__src;
  TypeBase **ppTVar1;
  TypeHandle *pTVar2;
  undefined4 extraout_var;
  char *__dest;
  size_t sVar3;
  uint uVar4;
  TypeHandle *pTVar5;
  int iVar6;
  TypeHandle *pTVar7;
  TypeHandle *arg;
  InplaceStr IVar8;
  
  pTVar5 = types.tail;
  pTVar7 = types.head;
  if (pTVar7 == (TypeHandle *)0x0) {
    uVar4 = 3;
  }
  else {
    iVar6 = 2;
    pTVar2 = pTVar7;
    do {
      ppTVar1 = &pTVar2->type;
      pTVar2 = pTVar2->next;
      uVar4 = *(int *)&((*ppTVar1)->name).end - *(int *)&((*ppTVar1)->name).begin;
      pTVar5 = (TypeHandle *)(ulong)uVar4;
      iVar6 = iVar6 + (uint)(pTVar2 != (TypeHandle *)0x0) + uVar4;
    } while (pTVar2 != (TypeHandle *)0x0);
    uVar4 = iVar6 + 1;
  }
  iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar4,pTVar5);
  IVar8.begin = (char *)CONCAT44(extraout_var,iVar6);
  *IVar8.begin = '(';
  __dest = IVar8.begin;
  for (; __dest = __dest + 1, pTVar7 != (TypeHandle *)0x0; pTVar7 = pTVar7->next) {
    __src = (pTVar7->type->name).begin;
    memcpy(__dest,__src,(ulong)(uint)(*(int *)&(pTVar7->type->name).end - (int)__src));
    __dest = __dest + (uint)(*(int *)&(pTVar7->type->name).end - *(int *)&(pTVar7->type->name).begin
                            );
    if (pTVar7->next == (TypeHandle *)0x0) break;
    *__dest = ',';
  }
  __dest[0] = ')';
  __dest[1] = '\0';
  sVar3 = strlen(IVar8.begin);
  if (sVar3 + 1 == (ulong)uVar4) {
    IVar8.end = IVar8.begin + sVar3;
    return IVar8;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x148,
                "InplaceStr GetArgumentSetTypeName(ExpressionContext &, IntrusiveList<TypeHandle>)")
  ;
}

Assistant:

InplaceStr GetArgumentSetTypeName(ExpressionContext &ctx, IntrusiveList<TypeHandle> types)
{
	unsigned nameLength = 2;

	for(TypeHandle *arg = types.head; arg; arg = arg->next)
		nameLength += arg->type->name.length() + (arg->next ? 1 : 0);

	nameLength += 1;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '(';

	for(TypeHandle *arg = types.head; arg; arg = arg->next)
	{
		memcpy(pos, arg->type->name.begin, arg->type->name.length());
		pos += arg->type->name.length();

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = ')';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}